

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_FundRawTransaction_BTC1_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_BTC1_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *in_R9;
  long *expected_predicate_value;
  char *in_stack_00000110;
  char *in_stack_00000118;
  char *in_stack_00000120;
  int64_t in_stack_00000128;
  void *in_stack_00000130;
  void *in_stack_00000138;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  char *address;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  char *output_tx_hex;
  uint32_t append_txout_count;
  int64_t tx_fee_amount;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  string txid;
  Utxo *utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range2;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  uint32_t target_asset_count;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  uint32_t vout1;
  char *txid1;
  int64_t amount;
  char *tx;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *create_handle;
  int64_t knapsack_min_change;
  double dust_fee_rate;
  double long_term_fee_rate;
  double effective_fee_rate;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  void *fund_handle;
  anon_class_1_0_00000001 convert_to_byte;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *kDescriptor;
  undefined1 in_stack_00000cff;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  undefined4 in_stack_fffffffffffff8b8;
  uint32_t in_stack_fffffffffffff8bc;
  char *in_stack_fffffffffffff8c0;
  void *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e4;
  undefined1 in_stack_fffffffffffff8e5;
  undefined1 in_stack_fffffffffffff8e6;
  undefined1 in_stack_fffffffffffff8e7;
  char *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  undefined8 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  void *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  size_t in_stack_fffffffffffff958;
  uint32_t in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  anon_class_1_0_00000001 *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  char *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff984;
  char *in_stack_fffffffffffff988;
  char **in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  char *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  char *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  char *in_stack_fffffffffffffa08;
  uint32_t asset_index;
  undefined4 in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  uint32_t in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  uint32_t uVar7;
  char *in_stack_fffffffffffffa68;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffa78;
  AssertHelper local_580;
  Message local_578;
  undefined4 local_56c;
  AssertionResult local_568;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  AssertHelper local_530;
  Message local_528;
  AssertionResult local_520;
  AssertHelper local_510;
  Message local_508;
  undefined4 local_4fc;
  AssertionResult local_4f8;
  char *local_4e8;
  AssertHelper local_4e0;
  Message local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined4 local_4ac;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  undefined4 local_484;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  undefined4 local_45c;
  AssertionResult local_458;
  char *local_448;
  undefined4 local_43c;
  undefined8 local_438;
  AssertHelper local_430;
  Message local_428;
  undefined4 local_41c;
  AssertionResult local_418;
  AssertHelper local_408;
  Message local_400;
  undefined4 local_3f4;
  void **in_stack_fffffffffffffc10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc18;
  uint32_t in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc28;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0;
  AssertHelper local_390;
  Message local_388;
  undefined4 local_37c;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  undefined4 local_354;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined4 local_32c;
  AssertionResult local_328;
  Txid local_318;
  string local_2f8;
  void **in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  void *in_stack_fffffffffffffd48;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_2a8;
  undefined1 *local_2a0;
  AssertHelper in_stack_fffffffffffffd68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd70;
  int64_t *in_stack_fffffffffffffd78;
  double in_stack_fffffffffffffd80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  AssertHelper in_stack_fffffffffffffd90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd98;
  AssertionResult local_258;
  undefined4 local_244;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  undefined4 local_17c;
  char *local_178;
  undefined8 local_170;
  char *local_168;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_129;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  long local_f0 [5];
  undefined1 local_c8 [24];
  char **local_b0;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_69;
  AssertionResult local_68;
  AssertHelper local_58;
  Message local_50 [3];
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  long local_18;
  char *local_10;
  
  local_10 = 
  "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))"
  ;
  local_18 = 0;
  local_1c = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8))
  ;
  local_34 = 0;
  this_00 = &local_30;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar1) {
    testing::Message::Message(local_50);
    in_stack_fffffffffffffa68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3cbb69);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x43b,in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x3cbbcc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cbc21);
  local_69 = local_18 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
             (bool *)in_stack_fffffffffffff898,(type *)0x3cbc55);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa64);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_68,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x43c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message((Message *)0x3cbd51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cbdcc);
  local_b0 = (char **)0x0;
  CfdGetElementsUtxoListByC((bool)in_stack_00000cff);
  local_f0[4] = 0x4024000000000000;
  local_f0[3] = 0x4024000000000000;
  local_f0[2] = 0xbff0000000000000;
  local_f0[1] = 0xffffffffffffffff;
  local_f0[0] = 0;
  expected_predicate_value = local_f0;
  local_1c = CfdInitializeTransaction
                       (in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
                        in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                        in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_104 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cbf32);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x44f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x3cbf95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cbfea);
  local_129 = local_f0[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
             (bool *)in_stack_fffffffffffff898,(type *)0x3cc016);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)&local_128,(AssertionResult *)"(NULL == create_handle)","true"
               ,"false",(char *)expected_predicate_value);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x450,pcVar5);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message((Message *)0x3cc114);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc18f);
  local_168 = (char *)0x0;
  local_170 = 0x6b22c20;
  local_178 = "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff";
  local_17c = 0;
  if (local_1c == 0) {
    local_1c = CfdAddTransactionInput
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffa78),this_00,
                          in_stack_fffffffffffffa68,uVar7,in_stack_fffffffffffffa60);
    local_194 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cc2b7);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x458,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message((Message *)0x3cc31a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc372);
    local_1c = CfdAddTransactionOutput
                         (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
                          in_stack_00000118,in_stack_00000110);
    local_1bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar2) {
      testing::Message::Message(&local_1c8);
      in_stack_fffffffffffffa18 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cc45c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45c,in_stack_fffffffffffffa18);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x3cc4bf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc517);
    in_stack_fffffffffffffa14 =
         CfdFinalizeTransaction
                   ((void *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                    in_stack_fffffffffffff898,(char **)0x3cc534);
    local_1e4 = 0;
    local_1c = in_stack_fffffffffffffa14;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    in_stack_fffffffffffffa10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa10);
    if (!bVar2) {
      testing::Message::Message(&local_1f0);
      in_stack_fffffffffffffa08 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cc5f2);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45e,in_stack_fffffffffffffa08);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x3cc655);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc6aa);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_208,
               "\"0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000\""
               ,"tx",
               "0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
               ,local_168);
    in_stack_fffffffffffffa07 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!(bool)in_stack_fffffffffffffa07) {
      testing::Message::Message(&local_210);
      in_stack_fffffffffffff9f8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cc745);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x45f,in_stack_fffffffffffff9f8);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x3cc7a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc800);
    in_stack_fffffffffffff9f4 =
         CfdFreeTransactionHandle
                   ((void *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                    in_stack_fffffffffffff898);
    local_22c = 0;
    local_1c = in_stack_fffffffffffff9f4;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    in_stack_fffffffffffff9f0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff9f0);
    if (!bVar2) {
      testing::Message::Message(&local_238);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cc8d3);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x461,pcVar5);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x3cc936);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cc98b);
  }
  local_244 = 1;
  if (local_1c == 0) {
    local_1c = CfdInitializeFundRawTx
                         (in_stack_fffffffffffffc28.ptr_,in_stack_fffffffffffffc24,
                          in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18.ptr_,
                          in_stack_fffffffffffffc10);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd98);
      in_stack_fffffffffffff9d8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cca84);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x468,in_stack_fffffffffffff9d8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd90,(Message *)&stack0xfffffffffffffd98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd90);
      testing::Message::~Message((Message *)0x3ccae7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ccb3c);
    in_stack_fffffffffffffd78 = (int64_t *)0x0;
    testing::internal::CmpHelperNE<decltype(nullptr),void*>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (void **)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (void **)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    in_stack_fffffffffffff9d7 =
         testing::AssertionResult::operator_cast_to_bool
                   ((AssertionResult *)&stack0xfffffffffffffd80);
    if (!(bool)in_stack_fffffffffffff9d7) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd70);
      in_stack_fffffffffffff9c8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3ccbe4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x469,in_stack_fffffffffffff9c8);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd68,(Message *)&stack0xfffffffffffffd70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd68);
      testing::Message::~Message((Message *)0x3ccc47);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ccc9c);
  }
  if (local_1c == 0) {
    local_2a0 = local_c8;
    local_2a8._M_current =
         (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                           (in_stack_fffffffffffff898);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end(in_stack_fffffffffffff898);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                          *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                          *)in_stack_fffffffffffff898);
      uVar7 = (uint32_t)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
      asset_index = (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20);
      if (!bVar2) break;
      __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
      ::operator*(&local_2a8);
      TestBody()::$_0::operator()[abi_cxx11_
                (in_stack_fffffffffffff968,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                 in_stack_fffffffffffff958);
      in_stack_fffffffffffff9c0 = local_b0;
      cfd::core::Txid::Txid(&local_318,(string *)&stack0xfffffffffffffd28);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_2f8,&local_318);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff898 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x8971a8;
      local_1c = CfdAddUtxoForFundRawTx
                           ((void *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                            in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                            in_stack_fffffffffffff8bc,
                            CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                            (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                            (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                             CONCAT16(in_stack_fffffffffffff8e6,
                                                      CONCAT15(in_stack_fffffffffffff8e5,
                                                               CONCAT14(in_stack_fffffffffffff8e4,
                                                                        in_stack_fffffffffffff8e0)))
                                            ));
      std::__cxx11::string::~string((string *)&local_2f8);
      cfd::core::Txid::~Txid((Txid *)0x3cce1d);
      local_32c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
                 (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                 (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_328);
      if (!bVar2) {
        testing::Message::Message(&local_338);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ccf17);
        testing::internal::AssertHelper::AssertHelper
                  (&local_340,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x475,pcVar5);
        testing::internal::AssertHelper::operator=(&local_340,&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_340);
        testing::Message::~Message((Message *)0x3ccf7a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ccfcf);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
      __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
      ::operator++(&local_2a8);
    }
    in_stack_fffffffffffff8b8 = 0;
    in_stack_fffffffffffff8b0 = 0;
    in_stack_fffffffffffff8a8 = 0;
    in_stack_fffffffffffff8a0 = 0;
    local_1c = CfdAddTxInForFundRawTx
                         ((void *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                          in_stack_fffffffffffff908,
                          (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                          (uint32_t)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                          CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                          in_stack_fffffffffffff8e8,
                          (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                          (bool)in_stack_fffffffffffff8e7,(bool)in_stack_fffffffffffff8e6,
                          (bool)in_stack_fffffffffffff8e5,in_stack_fffffffffffff960,
                          (char *)in_stack_fffffffffffff968);
    uVar1 = (undefined1)((uint)in_stack_fffffffffffff964 >> 0x18);
    local_354 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    if (!bVar2) {
      testing::Message::Message(&local_360);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cd113);
      testing::internal::AssertHelper::AssertHelper
                (&local_368,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x47e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_368,&local_360);
      testing::internal::AssertHelper::~AssertHelper(&local_368);
      testing::Message::~Message((Message *)0x3cd176);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd1ce);
    local_1c = CfdAddTargetAmountForFundRawTx
                         (in_stack_fffffffffffffa18,
                          (void *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                          asset_index,CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                          in_stack_fffffffffffff9f8,
                          (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    local_37c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_378);
    if (!bVar2) {
      testing::Message::Message(&local_388);
      in_stack_fffffffffffff988 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cd2b6);
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x482,in_stack_fffffffffffff988);
      testing::internal::AssertHelper::operator=(&local_390,&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      testing::Message::~Message((Message *)0x3cd319);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd371);
    iVar3 = CfdSetOptionFundRawTx
                      (in_stack_fffffffffffff988,
                       (void *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                       (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (double)in_stack_fffffffffffff968,(bool)uVar1);
    local_3a4 = 0;
    local_1c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3a0);
    uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff980);
    if (!bVar2) {
      testing::Message::Message(&local_3b0);
      in_stack_fffffffffffff978 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3cd454);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x486,in_stack_fffffffffffff978);
      testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper(&local_3b8);
      testing::Message::~Message((Message *)0x3cd4b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd50f);
    in_stack_fffffffffffff974 =
         CfdSetOptionFundRawTx
                   (in_stack_fffffffffffff988,(void *)CONCAT44(iVar3,uVar6),
                    (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                    (double)in_stack_fffffffffffff968,(bool)uVar1);
    local_1c = in_stack_fffffffffffff974;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
    in_stack_fffffffffffff970 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff970);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc28);
      in_stack_fffffffffffff968 =
           (anon_class_1_0_00000001 *)
           testing::AssertionResult::failure_message((AssertionResult *)0x3cd5f6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x489,(char *)in_stack_fffffffffffff968);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc20,(Message *)&stack0xfffffffffffffc28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc20);
      testing::Message::~Message((Message *)0x3cd659);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd6b1);
    iVar4 = CfdSetOptionFundRawTx
                      (in_stack_fffffffffffff988,(void *)CONCAT44(iVar3,uVar6),
                       (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       (double)in_stack_fffffffffffff968,(bool)uVar1);
    local_3f4 = 0;
    local_1c = iVar4;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    uVar1 = (undefined1)((uint)iVar4 >> 0x18);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc10);
    if (!bVar2) {
      testing::Message::Message(&local_400);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cd798);
      testing::internal::AssertHelper::AssertHelper
                (&local_408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x48c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_408,&local_400);
      testing::internal::AssertHelper::~AssertHelper(&local_408);
      testing::Message::~Message((Message *)0x3cd7fb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd853);
    local_1c = CfdSetOptionFundRawTx
                         (in_stack_fffffffffffff988,(void *)CONCAT44(iVar3,uVar6),
                          (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                          CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                          (double)in_stack_fffffffffffff968,(bool)uVar1);
    local_41c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_418);
    if (!bVar2) {
      testing::Message::Message(&local_428);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cd939);
      testing::internal::AssertHelper::AssertHelper
                (&local_430,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x48f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_430,&local_428);
      testing::internal::AssertHelper::~AssertHelper(&local_430);
      testing::Message::~Message((Message *)0x3cd99c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cd9f4);
    local_438 = 0;
    local_43c = 0;
    local_448 = (char *)0x0;
    local_1c = CfdFinalizeFundRawTx
                         (in_stack_fffffffffffffd98.ptr_,in_stack_fffffffffffffd90.data_,
                          (char *)in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78,(uint32_t *)in_stack_fffffffffffffd70.ptr_,
                          (char **)in_stack_fffffffffffffd68.data_);
    local_45c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_458);
    if (!bVar2) {
      testing::Message::Message(&local_468);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cdb13);
      testing::internal::AssertHelper::AssertHelper
                (&local_470,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x497,pcVar5);
      testing::internal::AssertHelper::operator=(&local_470,&local_468);
      testing::internal::AssertHelper::~AssertHelper(&local_470);
      testing::Message::~Message((Message *)0x3cdb76);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cdbcb);
    local_484 = 0xa0a;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (long *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_480);
    if (!bVar2) {
      testing::Message::Message(&local_490);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cdc72);
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x498,pcVar5);
      testing::internal::AssertHelper::operator=(&local_498,&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      testing::Message::~Message((Message *)0x3cdcd5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cdd2a);
    local_4ac = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (uint *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar2) {
      testing::Message::Message(&local_4b8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cddd1);
      testing::internal::AssertHelper::AssertHelper
                (&local_4c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x499,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4c0);
      testing::Message::~Message((Message *)0x3cde34);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cde89);
    if (local_1c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_4d0,
                 "\"0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000\""
                 ,"output_tx_hex",
                 "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,local_448);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
      if (!bVar2) {
        testing::Message::Message(&local_4d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3cdf2c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x49b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
        testing::internal::AssertHelper::~AssertHelper(&local_4e0);
        testing::Message::~Message((Message *)0x3cdf89);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3cdfde);
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    }
    local_4e8 = (char *)0x0;
    local_1c = CfdGetAppendTxOutFundRawTx
                         (in_stack_fffffffffffff9d8,
                          (void *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                          uVar7,in_stack_fffffffffffff9c0);
    local_4fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
               (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
    if (!bVar2) {
      testing::Message::Message(&local_508);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ce0cc);
      testing::internal::AssertHelper::AssertHelper
                (&local_510,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4a1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_510,&local_508);
      testing::internal::AssertHelper::~AssertHelper(&local_510);
      testing::Message::~Message((Message *)0x3ce129);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ce17e);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_520,"\"bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce\"","address",
               "bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce",local_4e8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
    if (!bVar2) {
      testing::Message::Message(&local_528);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ce213);
      testing::internal::AssertHelper::AssertHelper
                (&local_530,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x4a2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_530,&local_528);
      testing::internal::AssertHelper::~AssertHelper(&local_530);
      testing::Message::~Message((Message *)0x3ce270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ce2c5);
    if (local_1c == 0) {
      CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    }
  }
  local_1c = CfdFreeFundRawTxHandle
                       (in_stack_fffffffffffff978,
                        (void *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  local_544 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_540);
  if (!bVar2) {
    testing::Message::Message(&local_550);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ce3a9);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4a8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message((Message *)0x3ce406);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ce45e);
  CfdFreeStringBuffer((char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_1c = CfdFreeHandle((void *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
  local_56c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),
             (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
             (CfdErrorCode *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_568);
  if (!bVar2) {
    testing::Message::Message(&local_578);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ce52c);
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x4ad,pcVar5);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    testing::Message::~Message((Message *)0x3ce589);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ce5de);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0));
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_BTC1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> std::string {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    std::vector<uint8_t> reverse_buffer(bytes.crbegin(), bytes.crend());
    return ByteData(reverse_buffer).GetHex();
  };

  void* fund_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  double effective_fee_rate = 10.0;
  double long_term_fee_rate = 10.0;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(
      handle, kCfdNetworkMainnet, 1, 17, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));

  char* tx = nullptr;
  int64_t amount = 112340000;
  const char* txid1 = "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff";
  uint32_t vout1 = 0;
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(handle, create_handle, txid1, vout1, 0xfffffffe);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddTransactionOutput(
        handle, create_handle, amount, "bc1qcevcszwsnmd2ew857n2mnwq7gsf62ujrutrfch",
        nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdFinalizeTransaction(handle, create_handle, &tx);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("0100000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff01202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000", tx);
    ret = CfdFreeTransactionHandle(handle, create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  uint32_t target_asset_count = 1;
  if (ret == kCfdSuccess) {
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkMainnet, target_asset_count, nullptr, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
  }

  if (ret == kCfdSuccess) {
    for (const auto& utxo : utxos) {
      std::string txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddUtxoForFundRawTx(
          handle, fund_handle,
          Txid(txid).GetHex().c_str(), utxo.vout,
          utxo.amount,
          kDescriptor,
          "");
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddTxInForFundRawTx(handle, fund_handle,
        "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
        amount,  kDescriptor, "", false, false, false, 0, "");
    // ret = CfdAddTxInputForFundRawTx(handle, fund_handle,
    //     "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff", 0,
    //     amount,  kDescriptor, "", false, false, false, "", 0, 0, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 65976100,
        "", "bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
        0, 0, true);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxDustFeeRate,
        0, dust_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxLongTermFeeRate,
        0, long_term_fee_rate, false);
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxKnapsackMinChange,
        knapsack_min_change, 0, false);
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t tx_fee_amount = 0;
    uint32_t append_txout_count = 0;
    char* output_tx_hex = nullptr;
    ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
        effective_fee_rate, &tx_fee_amount, &append_txout_count,
        &output_tx_hex);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2570, tx_fee_amount);
    EXPECT_EQ(1, append_txout_count);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff02202cb20600000000160014c6598809d09edaacb8f4f4d5b9b81e4413a57243be0da804000000001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000", output_tx_hex);
      CfdFreeStringBuffer(output_tx_hex);
    }

    char* address = nullptr;
    ret = CfdGetAppendTxOutFundRawTx(handle, fund_handle, 0, &address);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("bc1qdnf34k9c255nfa9anjx0sj5ne0t6f80p72wpce", address);
    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(address);
    }
  }
  ret = CfdFreeFundRawTxHandle(handle, fund_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  CfdFreeStringBuffer(tx);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}